

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerImpl::HandleJoinerSessionTimer(CommissionerImpl *this,Timer *aTimer)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  iterator iVar4;
  iterator __position;
  char *pcVar5;
  ByteArray *aBytes;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  string_view fmt;
  allocator local_109;
  TimePoint local_108;
  ulong local_100;
  Timer *local_f8;
  _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>>
  *local_f0;
  long local_e8;
  _Base_ptr local_e0;
  string local_d8;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  string local_80;
  writer write;
  undefined8 local_48;
  char *pcStack_40;
  
  local_e8 = std::chrono::_V2::system_clock::now();
  std::__cxx11::string::string((string *)&local_d8,"joiner-session",(allocator *)&write);
  local_b8.types_[0] = none_type;
  local_b8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
       "joiner session timer triggered";
  local_b8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
  local_b8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
  local_b8.context_.super_basic_format_parse_context<char>._20_4_ = 0;
  local_b8.parse_funcs_[0] = (parse_func)0x0;
  pcVar3 = "joiner session timer triggered";
  local_b8.context_.types_ = local_b8.types_;
  while (pcVar5 = pcVar3, pcVar5 != "") {
    pcVar3 = pcVar5 + 1;
    if (*pcVar5 == '}') {
      if ((pcVar3 == "") || (*pcVar3 != '}')) {
        ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
      }
      pcVar3 = pcVar5 + 2;
    }
    else if (*pcVar5 == '{') {
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar5,"",&local_b8);
    }
  }
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_b8;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_80,(v10 *)"joiner session timer triggered",(string_view)ZEXT816(0x1e),args);
  local_f8 = aTimer;
  Log(kDebug,&local_d8,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_d8);
  local_f0 = (_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>>
              *)&this->mJoinerSessions;
  local_e0 = &(this->mJoinerSessions)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_108.__d.__r = (duration)0;
  local_100 = 0;
  __position._M_node = (this->mJoinerSessions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    while( true ) {
      if (__position._M_node == local_e0) {
        if ((local_100 & 1) != 0) {
          Timer::Start(local_f8,local_108);
        }
        return;
      }
      lVar2 = *(long *)(__position._M_node + 0x19);
      if (lVar2 <= local_e8) break;
      if (lVar2 < (long)local_108.__d.__r) {
        local_108.__d.__r = (duration)(duration)lVar2;
      }
      if ((local_100 & 1) == 0) {
        local_108.__d.__r = (duration)(duration)lVar2;
      }
      __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      local_100 = CONCAT71((int7)((ulong)__position._M_node >> 8),1);
    }
    iVar4 = std::
            _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>>
            ::erase_abi_cxx11_(local_f0,__position);
    std::__cxx11::string::string((string *)&local_d8,"joiner-session",&local_109);
    local_b8.types_[0] = string_type;
    local_b8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "joiner session (joiner ID={}) removed";
    local_b8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x25;
    local_b8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_b8.context_.super_basic_format_parse_context<char>._20_4_ = 1;
    local_b8.parse_funcs_[0] =
         ::fmt::v10::detail::
         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
    pcVar3 = "joiner session (joiner ID={}) removed";
    local_b8.context_.types_ = local_b8.types_;
    write.handler_ = &local_b8;
    while (pcVar3 != "") {
      cVar1 = *pcVar3;
      pcVar5 = pcVar3;
      while (cVar1 != '{') {
        pcVar5 = pcVar5 + 1;
        if (pcVar5 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()(&write,pcVar3,"");
          goto LAB_001a1083;
        }
        cVar1 = *pcVar5;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::writer::operator()(&write,pcVar3,pcVar5);
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                         (pcVar5,"",&local_b8);
    }
LAB_001a1083:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&write,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &__position._M_node[2]._M_left);
    utils::Hex_abi_cxx11_((string *)&local_b8,(utils *)&write,aBytes);
    local_48 = CONCAT44(local_b8._4_4_,local_b8.types_[0]);
    pcStack_40 = local_b8.context_.super_basic_format_parse_context<char>.format_str_.data_;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_48;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x25;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_80,(v10 *)"joiner session (joiner ID={}) removed",fmt,args_00);
    Log(kInfo,&local_d8,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_b8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&write);
    std::__cxx11::string::~string((string *)&local_d8);
    __position = iVar4;
  } while( true );
}

Assistant:

void CommissionerImpl::HandleJoinerSessionTimer(Timer &aTimer)
{
    TimePoint nextShot;
    bool      hasNextShot = false;
    auto      now         = Clock::now();

    LOG_DEBUG(LOG_REGION_JOINER_SESSION, "joiner session timer triggered");

    auto it = mJoinerSessions.begin();
    while (it != mJoinerSessions.end())
    {
        auto &session = it->second;

        if (now >= session.GetExpirationTime())
        {
            it = mJoinerSessions.erase(it);

            LOG_INFO(LOG_REGION_JOINER_SESSION, "joiner session (joiner ID={}) removed",
                     utils::Hex(session.GetJoinerId()));
        }
        else
        {
            if (!hasNextShot || session.GetExpirationTime() < nextShot)
            {
                nextShot = session.GetExpirationTime();
            }
            hasNextShot = true;

            it++;
        }
    }

    if (hasNextShot)
    {
        aTimer.Start(nextShot);
    }
}